

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RangeSink::AddRange
          (RangeSink *this,char *analyzer,string_view name,uint64_t vmaddr,uint64_t vmsize,
          uint64_t fileoff,uint64_t filesize)

{
  string_view format;
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  undefined8 uVar4;
  char *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  string *in_R9;
  string *unaff_retaddr;
  Arg *in_stack_00000008;
  char *in_stack_00000010;
  uint64_t in_stack_00000018;
  RangeMap *in_stack_00000020;
  uint64_t common;
  string label;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *__range1;
  string *in_stack_fffffffffffffdc8;
  Arg *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  Arg *in_stack_fffffffffffffde0;
  uint64_t in_stack_fffffffffffffe08;
  Arg *a2;
  uint64_t in_stack_fffffffffffffe10;
  Arg *a1;
  RangeMap *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  Arg *in_stack_fffffffffffffe40;
  Arg *in_stack_fffffffffffffe48;
  string local_1a0 [32];
  reference local_180;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *local_178;
  __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
  local_170;
  long local_168;
  NameMunger *in_stack_fffffffffffffec8;
  string_view in_stack_fffffffffffffed0;
  Arg local_f0;
  char *in_stack_ffffffffffffff48;
  uint64_t in_stack_ffffffffffffff50;
  RangeSink *in_stack_ffffffffffffff58;
  undefined1 local_50 [32];
  string *local_30;
  char local_28 [8];
  char *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  if ((in_R9 != (string *)0xffffffffffffffff) && (in_stack_00000010 != (char *)0xffffffffffffffff))
  {
    local_30 = in_R9;
    local_28 = (char  [8])in_R8;
    local_20 = in_RSI;
    bVar1 = IsVerboseForVMRange(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                (uint64_t)in_stack_ffffffffffffff48);
    if ((bVar1) ||
       (bVar1 = IsVerboseForFileRange
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (uint64_t)in_stack_ffffffffffffff48), bVar1)) {
      in_stack_fffffffffffffe20 =
           GetDataSourceLabel((DataSource)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
      in_stack_fffffffffffffdd0 = in_stack_00000008;
      in_stack_fffffffffffffdd8 = in_stack_00000010;
      printf("[%s, %s] AddRange(%.*s, %lx, %lx, %lx, %lx)\n",in_stack_fffffffffffffe20,local_20,
             sVar2 & 0xffffffff,pvVar3,local_28);
      in_stack_fffffffffffffdc8 = local_30;
      in_stack_fffffffffffffe28 = local_20;
    }
    if ((*(long *)(in_RDI + 0xf0) == 0) ||
       ((bVar1 = RangeMap::CoversRange
                           (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                            in_stack_fffffffffffffe08), bVar1 &&
        (bVar1 = RangeMap::CoversRange
                           (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                            in_stack_fffffffffffffe08), bVar1)))) {
      local_168 = in_RDI + 0xf8;
      local_170._M_current =
           (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
           std::
           vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
           ::begin((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                    *)in_stack_fffffffffffffdc8);
      local_178 = (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
                  std::
                  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                  ::end((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                         *)in_stack_fffffffffffffdc8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                                 *)in_stack_fffffffffffffdd0,
                                (__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                                 *)in_stack_fffffffffffffdc8), bVar1) {
        local_180 = __gnu_cxx::
                    __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                    ::operator*(&local_170);
        NameMunger::Munge_abi_cxx11_(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
        std::min<unsigned_long>((unsigned_long *)&local_30,(unsigned_long *)&stack0x00000010);
        RangeMap::AddDualRange
                  (in_stack_00000020,in_stack_00000018,(uint64_t)in_stack_00000010,
                   (uint64_t)in_stack_00000008,unaff_retaddr);
        RangeMap::AddDualRange
                  (in_stack_00000020,in_stack_00000018,(uint64_t)in_stack_00000010,
                   (uint64_t)in_stack_00000008,unaff_retaddr);
        RangeMap::AddRange((RangeMap *)in_stack_fffffffffffffde0,(uint64_t)in_stack_fffffffffffffdd8
                           ,(uint64_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        RangeMap::AddRange((RangeMap *)in_stack_fffffffffffffde0,(uint64_t)in_stack_fffffffffffffdd8
                           ,(uint64_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        std::__cxx11::string::~string(local_1a0);
        __gnu_cxx::
        __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
        ::operator++(&local_170);
      }
    }
    else if (0 < verbose_level) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&in_stack_fffffffffffffde0->piece_,in_stack_fffffffffffffdd8);
      std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
      absl::substitute_internal::Arg::Arg
                (in_stack_fffffffffffffdd0,(Nullable<const_char_*>)in_stack_fffffffffffffdc8);
      a2 = (Arg *)&stack0xffffffffffffff40;
      absl::substitute_internal::Arg::Arg
                (in_stack_fffffffffffffde0,(unsigned_long)in_stack_fffffffffffffdd8);
      a1 = &local_f0;
      absl::substitute_internal::Arg::Arg
                (in_stack_fffffffffffffde0,(unsigned_long)in_stack_fffffffffffffdd8);
      absl::substitute_internal::Arg::Arg
                (in_stack_fffffffffffffde0,(unsigned_long)in_stack_fffffffffffffdd8);
      absl::substitute_internal::Arg::Arg
                (in_stack_fffffffffffffde0,(unsigned_long)in_stack_fffffffffffffdd8);
      format._M_str = in_stack_fffffffffffffe28;
      format._M_len = (size_t)in_stack_fffffffffffffe20;
      absl::Substitute_abi_cxx11_
                (format,(Arg *)local_50,a1,a2,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48);
      uVar4 = std::__cxx11::string::c_str();
      printf("WARNING: %s\n",uVar4);
      std::__cxx11::string::~string((string *)local_50);
    }
    return;
  }
  Throw((char *)in_stack_fffffffffffffde0,(int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
}

Assistant:

void RangeSink::AddRange(const char* analyzer, string_view name,
                         uint64_t vmaddr, uint64_t vmsize, uint64_t fileoff,
                         uint64_t filesize) {
  if (vmsize == RangeMap::kUnknownSize || filesize == RangeMap::kUnknownSize) {
    // AddRange() is used for segments and sections; the mappings that establish
    // the file <-> vm mapping.  The size should always be known.  Moreover it
    // would be unclear how the logic should work if the size was *not* known.
    THROW("AddRange() does not allow unknown size.");
  }

  if (IsVerboseForVMRange(vmaddr, vmsize) ||
      IsVerboseForFileRange(fileoff, filesize)) {
    printf("[%s, %s] AddRange(%.*s, %" PRIx64 ", %" PRIx64 ", %" PRIx64
           ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), vmaddr, vmsize, fileoff, filesize);
  }

  if (translator_) {
    if (!translator_->vm_map.CoversRange(vmaddr, vmsize) ||
        !translator_->file_map.CoversRange(fileoff, filesize)) {
      WARN("AddRange($0, $1, $2, $3, $4) will be ignored, because it is not "
           "covered by base map.",
           name.data(), vmaddr, vmsize, fileoff, filesize);
      return;
    }
  }

  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    uint64_t common = std::min(vmsize, filesize);

    pair.first->vm_map.AddDualRange(vmaddr, common, fileoff, label);
    pair.first->file_map.AddDualRange(fileoff, common, vmaddr, label);

    pair.first->vm_map.AddRange(vmaddr + common, vmsize - common, label);
    pair.first->file_map.AddRange(fileoff + common, filesize - common, label);
  }
}